

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectest-interp.cc
# Opt level: O1

string * __thiscall
spectest::ExpectedValueToString_abi_cxx11_
          (string *__return_storage_ptr__,spectest *this,ExpectedValue *ev)

{
  int iVar1;
  ExpectedValue *ev_00;
  char *format;
  int lane;
  int lane_00;
  string local_80;
  ExpectedValue local_60;
  
  if (*(int *)this + 4U < 2) {
    if (*(int *)(this + 0x20) == 2) {
      wabt::Type::GetName_abi_cxx11_((string *)&local_60,(Type *)this);
      format = "%s:nan:arithmetic";
    }
    else {
      if (*(int *)(this + 0x20) != 1) goto LAB_0012a703;
      wabt::Type::GetName_abi_cxx11_((string *)&local_60,(Type *)this);
      format = "%s:nan:canonical";
    }
    wabt::StringPrintf_abi_cxx11_(__return_storage_ptr__,format,local_60.value.type);
    if (local_60.value.type != (ValueType)((long)&local_60.value.value.field_0 + 8)) {
      operator_delete((void *)local_60.value.type,local_60.value.value.field_0._8_8_ + 1);
    }
  }
  else {
    if (*(int *)this == -5) {
      iVar1 = LaneCountFromType(*(Type *)(this + 0x18));
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"v128 ","");
      lane_00 = 0;
      do {
        GetLane(&local_60,(ExpectedValue *)this,lane_00);
        ExpectedValueToString_abi_cxx11_(&local_80,(spectest *)&local_60,ev_00);
        std::__cxx11::string::_M_append
                  ((char *)__return_storage_ptr__,(ulong)local_80._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_80._M_dataplus._M_p != &local_80.field_2) {
          operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
        }
        lane_00 = lane_00 + 1;
      } while (iVar1 != lane_00);
      return __return_storage_ptr__;
    }
LAB_0012a703:
    wabt::interp::TypedValueToString_abi_cxx11_(__return_storage_ptr__,(interp *)this,&ev->value);
  }
  return __return_storage_ptr__;
}

Assistant:

static std::string ExpectedValueToString(const ExpectedValue& ev) {
  // Extend TypedValueToString to print expected nan values too.
  switch (ev.value.type) {
    case Type::F32:
    case Type::F64:
      switch (ev.nan[0]) {
        case ExpectedNan::None:
          return TypedValueToString(ev.value);

        case ExpectedNan::Arithmetic:
          return StringPrintf("%s:nan:arithmetic",
                              ev.value.type.GetName().c_str());

        case ExpectedNan::Canonical:
          return StringPrintf("%s:nan:canonical",
                              ev.value.type.GetName().c_str());
      }
      break;

    case Type::V128: {
      int lane_count = LaneCountFromType(ev.lane_type);
      std::string result = "v128 ";
      for (int lane = 0; lane < lane_count; ++lane) {
        result += ExpectedValueToString(GetLane(ev, lane));
      }
      return result;
    }

    default:
      break;
  }
  return TypedValueToString(ev.value);
}